

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O1

void __thiscall
deqp::gls::anon_unknown_1::DrawTestShaderProgram::shadeVertices
          (DrawTestShaderProgram *this,VertexAttrib *inputs,VertexPacket **packets,int numPackets)

{
  int iVar1;
  GenericVecType GVar2;
  VertexPacket *pVVar3;
  int i;
  UniformSlot *pUVar4;
  pointer pGVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  Vec3 color;
  Vec2 coord;
  Vector<float,_3> res;
  undefined8 local_b8;
  float local_b0;
  Vec4 local_a8;
  float local_90 [2];
  undefined8 local_88;
  ulong uStack_80;
  float local_70;
  float local_6c;
  float local_68 [4];
  ulong local_58;
  VertexPacket **local_50;
  ulong local_48;
  float local_40 [4];
  
  local_50 = packets;
  pUVar4 = sglr::ShaderProgram::getUniformByName(&this->super_ShaderProgram,"u_coordScale");
  local_6c = (pUVar4->value).f;
  pUVar4 = sglr::ShaderProgram::getUniformByName(&this->super_ShaderProgram,"u_colorScale");
  if (0 < numPackets) {
    local_70 = (pUVar4->value).f;
    local_58 = (ulong)(uint)numPackets;
    local_48 = 0;
    do {
      pVVar3 = local_50[local_48];
      local_90[0] = 0.0;
      local_90[1] = 0.0;
      local_b8 = &DAT_3f8000003f800000;
      local_b0 = 1.0;
      pGVar5 = (this->m_attrType).
               super__Vector_base<rr::GenericVecType,_std::allocator<rr::GenericVecType>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (0 < (int)((ulong)((long)(this->m_attrType).
                                  super__Vector_base<rr::GenericVecType,_std::allocator<rr::GenericVecType>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pGVar5) >> 2))
      {
        uVar8 = 0;
        do {
          iVar1 = (this->m_componentCount).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar8];
          uVar7 = 1L << ((byte)uVar8 & 0x3f) &
                  (this->m_isCoord).super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar8 >> 6];
          GVar2 = pGVar5[uVar8];
          if (GVar2 == GENERICVECTYPE_INT32) {
            local_a8.m_data[0] = 0.0;
            local_a8.m_data[1] = 0.0;
            local_a8.m_data[2] = 0.0;
            local_a8.m_data[3] = 0.0;
            rr::readVertexAttrib
                      ((IVec4 *)&local_a8,inputs + uVar8,pVVar3->instanceNdx,pVVar3->vertexNdx);
            if (uVar7 == 0) {
              switch(iVar1 + -1) {
              case 0:
                local_88 = (undefined1 *)0x0;
                uStack_80 = uStack_80 & 0xffffffff00000000;
                lVar6 = 0;
                do {
                  local_90[lVar6 + 2] =
                       *(float *)((long)&local_b8 + lVar6 * 4) * (float)(int)local_a8.m_data[0];
                  lVar6 = lVar6 + 1;
                } while (lVar6 != 3);
LAB_004c0c3d:
                local_b0 = (float)uStack_80;
                local_b8 = local_88;
                break;
              case 1:
                local_a8.m_data[0] = (float)(int)local_a8.m_data[0] * (float)local_b8;
                fVar9 = (float)(int)local_a8.m_data[1];
LAB_004c106d:
                local_b8._4_4_ = fVar9 * local_b8._4_4_;
LAB_004c10de:
                local_b8 = (undefined1 *)CONCAT44(local_b8._4_4_,local_a8.m_data[0]);
                break;
              case 2:
                local_b8._0_4_ = (float)(int)local_a8.m_data[0] * (float)local_b8;
                local_b8._4_4_ = (float)(int)local_a8.m_data[1] * local_b8._4_4_;
                fVar9 = (float)(int)local_a8.m_data[2];
LAB_004c0fa2:
                local_b0 = fVar9 * local_b0;
                goto LAB_004c10ba;
              case 3:
                fVar10 = (float)(int)local_a8.m_data[3];
                local_b8 = (undefined1 *)
                           CONCAT44((float)(int)local_a8.m_data[1] * local_b8._4_4_ * fVar10,
                                    (float)(int)local_a8.m_data[0] * (float)local_b8 * fVar10);
                fVar9 = (float)(int)local_a8.m_data[2];
LAB_004c104a:
                local_b0 = fVar9 * local_b0 * fVar10;
                goto LAB_004c10ba;
              }
            }
            else {
              switch(iVar1 + -1) {
              case 0:
                local_88 = (undefined1 *)
                           CONCAT44((float)(int)local_a8.m_data[0],(float)(int)local_a8.m_data[0]);
                lVar6 = 0;
                do {
                  local_90[lVar6] = local_90[lVar6 + 2] + local_90[lVar6];
                  lVar6 = lVar6 + 1;
                } while (lVar6 == 1);
                break;
              case 1:
                local_88 = (undefined1 *)
                           CONCAT44((float)(int)local_a8.m_data[1],(float)(int)local_a8.m_data[0]);
                lVar6 = 0;
                do {
                  local_90[lVar6] = local_90[lVar6 + 2] + local_90[lVar6];
                  lVar6 = lVar6 + 1;
                } while (lVar6 == 1);
                break;
              case 2:
                local_88 = (undefined1 *)
                           CONCAT44((float)(int)local_a8.m_data[1],
                                    (float)(int)local_a8.m_data[2] + (float)(int)local_a8.m_data[0])
                ;
                lVar6 = 0;
                do {
                  local_90[lVar6] = local_90[lVar6 + 2] + local_90[lVar6];
                  lVar6 = lVar6 + 1;
                } while (lVar6 == 1);
                break;
              case 3:
                local_88 = (undefined1 *)
                           CONCAT44((float)(int)local_a8.m_data[3] + (float)(int)local_a8.m_data[1],
                                    (float)(int)local_a8.m_data[2] + (float)(int)local_a8.m_data[0])
                ;
                lVar6 = 0;
                do {
                  local_90[lVar6] = local_90[lVar6 + 2] + local_90[lVar6];
                  lVar6 = lVar6 + 1;
                } while (lVar6 == 1);
              }
            }
          }
          else if (GVar2 == GENERICVECTYPE_UINT32) {
            local_a8.m_data[0] = 0.0;
            local_a8.m_data[1] = 0.0;
            local_a8.m_data[2] = 0.0;
            local_a8.m_data[3] = 0.0;
            rr::readVertexAttrib
                      ((UVec4 *)&local_a8,inputs + uVar8,pVVar3->instanceNdx,pVVar3->vertexNdx);
            if (uVar7 == 0) {
              switch(iVar1 + -1) {
              case 0:
                local_88 = (undefined1 *)0x0;
                uStack_80 = uStack_80 & 0xffffffff00000000;
                lVar6 = 0;
                do {
                  local_90[lVar6 + 2] =
                       *(float *)((long)&local_b8 + lVar6 * 4) *
                       (float)(local_a8.m_data._0_8_ & 0xffffffff);
                  lVar6 = lVar6 + 1;
                } while (lVar6 != 3);
                goto LAB_004c0c3d;
              case 1:
                local_a8.m_data[0] = (float)(local_a8.m_data._0_8_ & 0xffffffff) * (float)local_b8;
                fVar9 = (float)(uint)local_a8.m_data[1];
                goto LAB_004c106d;
              case 2:
                local_b8._0_4_ = (float)(local_a8.m_data._0_8_ & 0xffffffff) * (float)local_b8;
                local_b8._4_4_ = (float)(uint)local_a8.m_data[1] * local_b8._4_4_;
                fVar9 = (float)(local_a8.m_data._8_8_ & 0xffffffff);
                goto LAB_004c0fa2;
              case 3:
                fVar10 = (float)(uint)local_a8.m_data[3];
                local_b8 = (undefined1 *)
                           CONCAT44((float)(uint)local_a8.m_data[1] * local_b8._4_4_ * fVar10,
                                    (float)(local_a8.m_data._0_8_ & 0xffffffff) * (float)local_b8 *
                                    fVar10);
                fVar9 = (float)(local_a8.m_data._8_8_ & 0xffffffff);
                goto LAB_004c104a;
              }
            }
            else {
              switch(iVar1 + -1) {
              case 0:
                local_88 = (undefined1 *)
                           CONCAT44((float)(local_a8.m_data._0_8_ & 0xffffffff),
                                    (float)(local_a8.m_data._0_8_ & 0xffffffff));
                lVar6 = 0;
                do {
                  local_90[lVar6] = local_90[lVar6 + 2] + local_90[lVar6];
                  lVar6 = lVar6 + 1;
                } while (lVar6 == 1);
                break;
              case 1:
                local_88 = (undefined1 *)
                           CONCAT44((float)(uint)local_a8.m_data[1],
                                    (float)(local_a8.m_data._0_8_ & 0xffffffff));
                lVar6 = 0;
                do {
                  local_90[lVar6] = local_90[lVar6 + 2] + local_90[lVar6];
                  lVar6 = lVar6 + 1;
                } while (lVar6 == 1);
                break;
              case 2:
                local_88 = (undefined1 *)
                           CONCAT44((float)(uint)local_a8.m_data[1],
                                    (float)(local_a8.m_data._8_8_ & 0xffffffff) +
                                    (float)(local_a8.m_data._0_8_ & 0xffffffff));
                lVar6 = 0;
                do {
                  local_90[lVar6] = local_90[lVar6 + 2] + local_90[lVar6];
                  lVar6 = lVar6 + 1;
                } while (lVar6 == 1);
                break;
              case 3:
                local_88 = (undefined1 *)
                           CONCAT44((float)(uint)local_a8.m_data[3] +
                                    (float)(uint)local_a8.m_data[1],
                                    (float)(local_a8.m_data._8_8_ & 0xffffffff) +
                                    (float)(local_a8.m_data._0_8_ & 0xffffffff));
                lVar6 = 0;
                do {
                  local_90[lVar6] = local_90[lVar6 + 2] + local_90[lVar6];
                  lVar6 = lVar6 + 1;
                } while (lVar6 == 1);
              }
            }
          }
          else if (GVar2 == GENERICVECTYPE_FLOAT) {
            local_a8.m_data._0_8_ = (undefined1 *)0x0;
            local_a8.m_data[2] = 0.0;
            local_a8.m_data[3] = 0.0;
            rr::readVertexAttrib(&local_a8,inputs + uVar8,pVVar3->instanceNdx,pVVar3->vertexNdx);
            if (uVar7 == 0) {
              switch(iVar1 + -1) {
              case 0:
                local_88 = (undefined1 *)0x0;
                uStack_80 = uStack_80 & 0xffffffff00000000;
                lVar6 = 0;
                do {
                  local_90[lVar6 + 2] = *(float *)((long)&local_b8 + lVar6 * 4) * local_a8.m_data[0]
                  ;
                  lVar6 = lVar6 + 1;
                } while (lVar6 != 3);
                goto LAB_004c0c3d;
              case 1:
                local_a8.m_data[0] = (float)local_b8 * local_a8.m_data[0];
                local_b8._4_4_ = local_b8._4_4_ * local_a8.m_data[1];
                goto LAB_004c10de;
              case 2:
                local_b8 = (undefined1 *)
                           CONCAT44(local_b8._4_4_ * local_a8.m_data[1],
                                    (float)local_b8 * local_a8.m_data[0]);
                local_b0 = local_b0 * local_a8.m_data[2];
                break;
              case 3:
                local_b8 = (undefined1 *)
                           CONCAT44(local_b8._4_4_ * local_a8.m_data[1] * local_a8.m_data[3],
                                    (float)local_b8 * local_a8.m_data[0] * local_a8.m_data[3]);
                local_b0 = local_b0 * local_a8.m_data[2] * local_a8.m_data[3];
                break;
              default:
                goto switchD_004c0a0d_default;
              }
LAB_004c10ba:
            }
            else {
              switch(iVar1 + -1) {
              case 0:
                local_88 = (undefined1 *)CONCAT44(local_a8.m_data[0],local_a8.m_data[0]);
                lVar6 = 0;
                do {
                  local_90[lVar6] = local_90[lVar6 + 2] + local_90[lVar6];
                  lVar6 = lVar6 + 1;
                } while (lVar6 == 1);
                break;
              case 1:
                local_88 = (undefined1 *)local_a8.m_data._0_8_;
                lVar6 = 0;
                do {
                  local_90[lVar6] = local_90[lVar6 + 2] + local_90[lVar6];
                  lVar6 = lVar6 + 1;
                } while (lVar6 == 1);
                break;
              case 2:
                local_88 = (undefined1 *)
                           CONCAT44(local_a8.m_data[1],local_a8.m_data[0] + local_a8.m_data[2]);
                lVar6 = 0;
                do {
                  local_90[lVar6] = local_90[lVar6 + 2] + local_90[lVar6];
                  lVar6 = lVar6 + 1;
                } while (lVar6 == 1);
                break;
              case 3:
                local_88 = (undefined1 *)
                           CONCAT44(local_a8.m_data[1] + local_a8.m_data[3],
                                    local_a8.m_data[0] + local_a8.m_data[2]);
                lVar6 = 0;
                do {
                  local_90[lVar6] = local_90[lVar6 + 2] + local_90[lVar6];
                  lVar6 = lVar6 + 1;
                } while (lVar6 == 1);
              }
            }
          }
switchD_004c0a0d_default:
          uVar8 = uVar8 + 1;
          pGVar5 = (this->m_attrType).
                   super__Vector_base<rr::GenericVecType,_std::allocator<rr::GenericVecType>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        } while ((long)uVar8 <
                 (long)(int)((ulong)((long)(this->m_attrType).
                                           super__Vector_base<rr::GenericVecType,_std::allocator<rr::GenericVecType>_>
                                           ._M_impl.super__Vector_impl_data._M_finish - (long)pGVar5
                                    ) >> 2));
      }
      (pVVar3->position).m_data[0] = local_90[0] * local_6c;
      (pVVar3->position).m_data[1] = local_90[1] * local_6c;
      *(undefined1 **)((pVVar3->position).m_data + 2) = &DAT_3f8000003f800000;
      pVVar3->pointSize = 1.0;
      local_68[0] = (float)local_b8 * local_70;
      local_68[1] = local_b8._4_4_ * local_70;
      local_68[2] = local_b0 * local_70;
      local_68[3] = 1.0;
      local_88 = (undefined1 *)0x0;
      uStack_80 = 0;
      lVar6 = 0;
      do {
        local_90[lVar6 + 2] = local_68[lVar6] * 0.5;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      local_40[0] = 0.5;
      local_40[1] = 0.5;
      local_40[2] = 0.5;
      local_40[3] = 0.5;
      local_a8.m_data[0] = 0.0;
      local_a8.m_data[1] = 0.0;
      local_a8.m_data[2] = 0.0;
      local_a8.m_data[3] = 0.0;
      lVar6 = 0;
      do {
        local_a8.m_data[lVar6] = local_90[lVar6 + 2] + local_40[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      pVVar3->outputs[0].v.uData[0] = (deUint32)local_a8.m_data[0];
      pVVar3->outputs[0].v.uData[1] = (deUint32)local_a8.m_data[1];
      pVVar3->outputs[0].v.uData[2] = (deUint32)local_a8.m_data[2];
      pVVar3->outputs[0].v.uData[3] = (deUint32)local_a8.m_data[3];
      local_48 = local_48 + 1;
    } while (local_48 != local_58);
  }
  return;
}

Assistant:

void DrawTestShaderProgram::shadeVertices (const rr::VertexAttrib* inputs, rr::VertexPacket* const* packets, const int numPackets) const
{
	const float	u_coordScale = getUniformByName("u_coordScale").value.f;
	const float u_colorScale = getUniformByName("u_colorScale").value.f;

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		const size_t varyingLocColor = 0;

		rr::VertexPacket& packet = *packets[packetNdx];

		// Calc output color
		tcu::Vec2 coord = tcu::Vec2(0.0, 0.0);
		tcu::Vec3 color = tcu::Vec3(1.0, 1.0, 1.0);

		for (int attribNdx = 0; attribNdx < (int)m_attrType.size(); attribNdx++)
		{
			const int	numComponents	= m_componentCount[attribNdx];
			const bool	isCoord			= m_isCoord[attribNdx];

			switch (m_attrType[attribNdx])
			{
				case rr::GENERICVECTYPE_FLOAT:	calcShaderColorCoord(coord, color, rr::readVertexAttribFloat(inputs[attribNdx], packet.instanceNdx, packet.vertexNdx), isCoord, numComponents);	break;
				case rr::GENERICVECTYPE_INT32:	calcShaderColorCoord(coord, color, rr::readVertexAttribInt	(inputs[attribNdx], packet.instanceNdx, packet.vertexNdx), isCoord, numComponents);	break;
				case rr::GENERICVECTYPE_UINT32:	calcShaderColorCoord(coord, color, rr::readVertexAttribUint	(inputs[attribNdx], packet.instanceNdx, packet.vertexNdx), isCoord, numComponents);	break;
				default:
					DE_ASSERT(false);
			}
		}

		// Transform position
		{
			packet.position = tcu::Vec4(u_coordScale * coord.x(), u_coordScale * coord.y(), 1.0f, 1.0f);
			packet.pointSize = 1.0f;
		}

		// Pass color to FS
		{
			packet.outputs[varyingLocColor] = tcu::Vec4(u_colorScale * color.x(), u_colorScale * color.y(), u_colorScale * color.z(), 1.0f) * 0.5f + tcu::Vec4(0.5f, 0.5f, 0.5f, 0.5f);
		}
	}
}